

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Socket::setLocalSocket(Socket *this,string *ipaddr,int port)

{
  int iVar1;
  char *__cp;
  runtime_error *prVar2;
  undefined1 local_2c [4];
  int ret;
  sockaddr_in localSockAddr;
  int port_local;
  string *ipaddr_local;
  Socket *this_local;
  
  localSockAddr.sin_zero._0_4_ = port;
  unique0x10000131 = ipaddr;
  memset(local_2c,0,0x10);
  local_2c._0_2_ = 2;
  local_2c._2_2_ = htons(localSockAddr.sin_zero._0_2_);
  __cp = (char *)std::__cxx11::string::c_str();
  iVar1 = inet_aton(__cp,(in_addr *)&ret);
  if (iVar1 == 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"setLocalSocket() - invalid ip address");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = bind(this->SocketFileDescriptor,(sockaddr *)local_2c,0x10);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"setLocalSocket(): bind failed, is port already in use?");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Socket::setLocalSocket(const std::string ipaddr, int port) {
  // zero out the structures
  struct sockaddr_in localSockAddr;
  std::memset((char *)&localSockAddr, 0, sizeof(localSockAddr));
  localSockAddr.sin_family = AF_INET;
  localSockAddr.sin_port = htons(port);

  int ret = inet_aton(ipaddr.c_str(), &localSockAddr.sin_addr);
  if (ret == 0) {
    throw std::runtime_error("setLocalSocket() - invalid ip address");
  }

  // bind socket to port
  ret = bind(SocketFileDescriptor, (struct sockaddr *)&localSockAddr, sizeof(localSockAddr));
  if (ret != 0) {
    throw std::runtime_error("setLocalSocket(): bind failed, is port already in use?");
  }
}